

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O1

void FAudio_UTF8_To_UTF16(char *src,uint16_t *dst,size_t len)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  uVar6 = len - 2;
  do {
    if (uVar6 < 2) break;
    bVar1 = *src;
    if (bVar1 == 0) {
      uVar7 = 0;
      pbVar5 = (byte *)src;
    }
    else if ((char)bVar1 < '\0') {
      if (bVar1 < 0xc0) {
LAB_0011d02e:
        pbVar5 = (byte *)src + 1;
      }
      else {
        if (0xdf < bVar1) {
          pbVar5 = (byte *)src + 1;
          if (bVar1 < 0xf0) {
            uVar7 = 0xffffffff;
            if (((((byte *)src)[1] & 0xc0) == 0x80) && ((((byte *)src)[2] & 0xc0) == 0x80)) {
              pbVar5 = (byte *)src + 3;
              uVar4 = (uint)((byte *)src)[1] * 0x40 + (uint)bVar1 * 0x1000 + (uint)((byte *)src)[2];
              if (uVar4 < 0xefc7f) {
                if ((1 < uVar4 - 0xefbff) && (uVar4 != 0xef880)) goto LAB_0011d2df;
              }
              else if ((1 < uVar4 - 0xefc7f) && ((uVar4 != 0xf0000 && (uVar4 != 0xf007f)))) {
LAB_0011d2df:
                if (0xf7fd < uVar4 - 0xe2880) goto LAB_0011d031;
                uVar7 = uVar4 - 0xe2080;
              }
            }
          }
          else if (bVar1 < 0xf8) {
            uVar7 = 0xffffffff;
            if ((((((byte *)src)[1] & 0xc0) == 0x80) && ((((byte *)src)[2] & 0xc0) == 0x80)) &&
               (bVar2 = ((byte *)src)[3], (bVar2 & 0xc0) == 0x80)) {
              pbVar5 = (byte *)src + 4;
              iVar8 = (uint)((byte *)src)[2] * 0x40 +
                      (uint)((byte *)src)[1] * 0x1000 + (uint)bVar1 * 0x40000;
              if (0xfffff < (uint)bVar2 + iVar8 + 0xfc36df80) goto LAB_0011d031;
              uVar7 = (uint)bVar2 + iVar8 + 0xfc37df80;
            }
          }
          else {
            uVar7 = 0xffffffff;
          }
          goto LAB_0011d03a;
        }
        bVar2 = ((byte *)src)[1];
        if ((bVar2 & 0xc0) != 0x80) goto LAB_0011d02e;
        pbVar5 = (byte *)src + 2;
        if (((uint)bVar1 * 0x40 + (uint)bVar2) - 0x3100 < 0x780) {
          uVar7 = ((uint)bVar1 * 0x40 + (uint)bVar2) - 0x3080;
          goto LAB_0011d03a;
        }
      }
LAB_0011d031:
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = (uint)bVar1;
      pbVar5 = (byte *)src + 1;
    }
LAB_0011d03a:
    if (uVar7 == 0) {
LAB_0011d05b:
      bVar3 = false;
    }
    else {
      uVar4 = 0x3f;
      if (uVar7 != 0xffffffff) {
        uVar4 = uVar7;
      }
      if (0xffff < uVar4) {
        if (uVar6 < 4) goto LAB_0011d05b;
        *dst = (ushort)(uVar4 + 0xf0000 >> 10) & 0x3ff | 0xd800;
        dst = dst + 1;
        uVar6 = uVar6 - 2;
        uVar4 = uVar4 & 0x3ff | 0xdc00;
      }
      *dst = (uint16_t)uVar4;
      dst = dst + 1;
      uVar6 = uVar6 - 2;
      bVar3 = true;
    }
    src = (char *)pbVar5;
  } while (bVar3);
  *dst = 0;
  return;
}

Assistant:

void FAudio_UTF8_To_UTF16(const char *src, uint16_t *dst, size_t len)
{
    len -= sizeof (uint16_t);   /* save room for null char. */
    while (len >= sizeof (uint16_t))
    {
        uint32_t cp = FAudio_UTF8_CodePoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* encode as surrogate pair */
        {
            if (len < (sizeof (uint16_t) * 2))
                break;  /* not enough room for the pair, stop now. */

            cp -= 0x10000;  /* Make this a 20-bit value */

            *(dst++) = 0xD800 + ((cp >> 10) & 0x3FF);
            len -= sizeof (uint16_t);

            cp = 0xDC00 + (cp & 0x3FF);
        } /* if */

        *(dst++) = cp;
        len -= sizeof (uint16_t);
    } /* while */

    *dst = 0;
}